

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O1

FT_Error cid_read_subrs(CID_Face face)

{
  uint uVar1;
  CID_FaceDict pCVar2;
  undefined8 *puVar3;
  long *plVar4;
  FT_Memory pFVar5;
  FT_Stream pFVar6;
  void *pvVar7;
  uint uVar8;
  CID_Subrs pCVar9;
  uchar *puVar10;
  CID_Face pCVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  FT_ULong count;
  CID_Face pCVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  FT_Error error;
  uint local_74;
  CID_Face local_70;
  ulong local_68;
  long *local_60;
  FT_Memory local_58;
  CID_Face local_50;
  FT_Stream local_48;
  FT_Int local_3c;
  void *local_38;
  
  local_58 = (face->root).memory;
  local_48 = face->cid_stream;
  local_38 = face->psaux;
  local_60 = (long *)0x0;
  local_70 = face;
  pCVar9 = (CID_Subrs)
           ft_mem_realloc(local_58,0x10,0,(ulong)(face->cid).num_dicts,(void *)0x0,
                          (FT_Error *)&local_74);
  face->subrs = pCVar9;
  if (local_74 == 0) {
    uVar12 = 0;
    if ((local_70->cid).num_dicts == 0) {
      local_60 = (long *)0x0;
    }
    else {
      uVar18 = 0;
      local_60 = (long *)0x0;
      do {
        pCVar2 = (local_70->cid).font_dicts;
        uVar1 = pCVar2[uVar18].num_subrs;
        if ((ulong)uVar1 == 0) {
          uVar14 = 5;
          pCVar11 = local_70;
        }
        else {
          local_3c = pCVar2[uVar18].private_dict.lenIV;
          local_50 = (CID_Face)(ulong)(uVar1 + 1);
          if ((uint)uVar12 < uVar1 + 1) {
            uVar14 = (uVar1 & 0xfffffffc) + 4;
            if ((uint)uVar12 < uVar14) {
              local_68 = uVar12;
              local_60 = (long *)ft_mem_qrealloc(local_58,8,uVar12 & 0xffffffff,(ulong)uVar14,
                                                 local_60,(FT_Error *)&local_74);
              bVar19 = local_74 == 0;
              pCVar11 = (CID_Face)CONCAT71((int7)((ulong)local_60 >> 8),bVar19);
              uVar12 = local_68 & 0xffffffff;
              if (bVar19) {
                uVar12 = (ulong)uVar14;
              }
              uVar14 = local_74;
              if (!bVar19) {
                uVar14 = 6;
              }
            }
            else {
              local_74 = 0xa0;
              pCVar11 = (CID_Face)0x0;
              uVar14 = 6;
            }
            if ((char)pCVar11 == '\0') goto LAB_0022ab47;
          }
          pFVar6 = local_48;
          local_68 = uVar12;
          local_74 = FT_Stream_Seek(local_48,(local_70->cid).data_offset +
                                             pCVar2[uVar18].subrmap_offset);
          pCVar16 = local_50;
          pCVar11 = (CID_Face)(ulong)local_74;
          uVar14 = 6;
          uVar12 = local_68;
          if (local_74 == 0) {
            iVar15 = (int)local_50;
            local_74 = FT_Stream_EnterFrame(pFVar6,(ulong)(pCVar2[uVar18].sd_bytes * iVar15));
            plVar4 = local_60;
            pCVar11 = (CID_Face)(ulong)local_74;
            if (local_74 == 0) {
              puVar10 = pFVar6->cursor;
              uVar14 = pCVar2[uVar18].sd_bytes;
              uVar12 = 0;
              do {
                if ((ulong)uVar14 == 0) {
                  uVar17 = 0;
                }
                else {
                  lVar13 = 0;
                  uVar17 = 0;
                  do {
                    uVar17 = uVar17 << 8 | (ulong)puVar10[lVar13];
                    lVar13 = lVar13 + 1;
                  } while (uVar14 != (uint)lVar13);
                }
                local_60[uVar12] = uVar17;
                uVar12 = uVar12 + 1;
                puVar10 = puVar10 + uVar14;
              } while (uVar12 != uVar1 + 1 + (uint)(iVar15 == 0));
              FT_Stream_ExitFrame(local_48);
              pFVar5 = local_58;
              pCVar11 = (CID_Face)&DAT_00000001;
              uVar14 = 6;
              do {
                if ((ulong)plVar4[(long)pCVar11] < (ulong)plVar4[(int)pCVar11 - 1])
                goto LAB_0022ac09;
                uVar8 = (int)pCVar11 + 1;
                pCVar11 = (CID_Face)(ulong)uVar8;
              } while (uVar8 <= uVar1);
              pCVar11 = (CID_Face)(local_48->size - (local_70->cid).data_offset);
              if (pCVar11 < (CID_Face)plVar4[uVar1]) {
LAB_0022ac09:
                local_74 = 3;
                uVar12 = local_68;
                goto LAB_0022ab47;
              }
              count = plVar4[uVar1] - *plVar4;
              pCVar11 = (CID_Face)
                        ft_mem_qrealloc(local_58,8,0,(ulong)pCVar16 & 0xffffffff,(void *)0x0,
                                        (FT_Error *)&local_74);
              pCVar9->code = (FT_Byte **)pCVar11;
              if (local_74 == 0) {
                pCVar11 = (CID_Face)ft_mem_qalloc(pFVar5,count,(FT_Error *)&local_74);
                pFVar6 = local_48;
                *pCVar9->code = (FT_Byte *)pCVar11;
                if (local_74 == 0) {
                  local_74 = FT_Stream_Seek(local_48,(local_70->cid).data_offset + *plVar4);
                  pCVar11 = (CID_Face)(ulong)local_74;
                  if (local_74 == 0) {
                    local_74 = FT_Stream_Read(pFVar6,*pCVar9->code,count);
                    pvVar7 = local_38;
                    pCVar11 = (CID_Face)(ulong)local_74;
                    if (local_74 == 0) {
                      pCVar16 = (CID_Face)((ulong)local_50 & 0xffffffff);
                      if ((uint)local_50 < 3) {
                        pCVar16 = (CID_Face)0x2;
                      }
                      pCVar11 = (CID_Face)&DAT_00000001;
                      do {
                        pCVar9->code[(long)pCVar11] =
                             pCVar9->code[(long)((long)&pCVar11[-1].cid_stream + 7)] +
                             (plVar4[(long)pCVar11] -
                             plVar4[(long)((long)&pCVar11[-1].cid_stream + 7)]);
                        pCVar11 = (CID_Face)((long)&(pCVar11->root).num_faces + 1);
                      } while (pCVar16 != pCVar11);
                      if (-1 < local_3c) {
                        local_50 = (CID_Face)(ulong)(uVar1 + (uVar1 == 0));
                        pCVar16 = (CID_Face)0x0;
                        do {
                          pCVar11 = (CID_Face)((long)&(pCVar16->root).num_faces + 1);
                          (**(code **)((long)pvVar7 + 0x20))
                                    (pCVar9->code[(long)pCVar16],
                                     plVar4[(long)((long)&(pCVar16->root).num_faces + 1)] -
                                     plVar4[(long)pCVar16],0x10ea);
                          pCVar16 = pCVar11;
                        } while (local_50 != pCVar11);
                      }
                      pCVar9->num_subrs = uVar1;
                      uVar14 = 0;
                      uVar12 = local_68;
                      goto LAB_0022ab47;
                    }
                  }
                }
              }
            }
            uVar14 = 6;
            uVar12 = local_68;
          }
        }
LAB_0022ab47:
        pFVar5 = local_58;
        pCVar16 = local_70;
        if ((uVar14 != 0) && (uVar14 != 5)) {
          if (uVar14 != 6) {
            return (FT_Error)pCVar11;
          }
          if (local_70->subrs != (CID_Subrs)0x0) {
            if ((local_70->cid).num_dicts != 0) {
              lVar13 = 8;
              uVar12 = 0;
              do {
                puVar3 = *(undefined8 **)((long)&local_70->subrs->num_subrs + lVar13);
                if (puVar3 != (undefined8 *)0x0) {
                  ft_mem_free(pFVar5,(void *)*puVar3);
                  **(undefined8 **)((long)&local_70->subrs->num_subrs + lVar13) = 0;
                }
                ft_mem_free(pFVar5,*(void **)((long)&pCVar16->subrs->num_subrs + lVar13));
                *(undefined8 *)((long)&pCVar16->subrs->num_subrs + lVar13) = 0;
                uVar12 = uVar12 + 1;
                lVar13 = lVar13 + 0x10;
              } while (uVar12 < (pCVar16->cid).num_dicts);
            }
            pCVar11 = local_70;
            ft_mem_free(pFVar5,local_70->subrs);
            pCVar11->subrs = (CID_Subrs)0x0;
          }
          break;
        }
        uVar18 = uVar18 + 1;
        pCVar9 = pCVar9 + 1;
      } while (uVar18 < (local_70->cid).num_dicts);
    }
  }
  ft_mem_free(local_58,local_60);
  return local_74;
}

Assistant:

static FT_Error
  cid_read_subrs( CID_Face  face )
  {
    CID_FaceInfo   cid    = &face->cid;
    FT_Memory      memory = face->root.memory;
    FT_Stream      stream = face->cid_stream;
    FT_Error       error;
    FT_UInt        n;
    CID_Subrs      subr;
    FT_UInt        max_offsets = 0;
    FT_ULong*      offsets = NULL;
    PSAux_Service  psaux = (PSAux_Service)face->psaux;


    if ( FT_NEW_ARRAY( face->subrs, cid->num_dicts ) )
      goto Exit;

    subr = face->subrs;
    for ( n = 0; n < cid->num_dicts; n++, subr++ )
    {
      CID_FaceDict  dict  = cid->font_dicts + n;
      FT_Int        lenIV = dict->private_dict.lenIV;
      FT_UInt       count, num_subrs = dict->num_subrs;
      FT_ULong      data_len;
      FT_Byte*      p;


      if ( !num_subrs )
        continue;

      /* reallocate offsets array if needed */
      if ( num_subrs + 1 > max_offsets )
      {
        FT_UInt  new_max = FT_PAD_CEIL( num_subrs + 1, 4 );


        if ( new_max <= max_offsets )
        {
          error = FT_THROW( Syntax_Error );
          goto Fail;
        }

        if ( FT_QRENEW_ARRAY( offsets, max_offsets, new_max ) )
          goto Fail;

        max_offsets = new_max;
      }

      /* read the subrmap's offsets */
      if ( FT_STREAM_SEEK( cid->data_offset + dict->subrmap_offset ) ||
           FT_FRAME_ENTER( ( num_subrs + 1 ) * dict->sd_bytes )      )
        goto Fail;

      p = (FT_Byte*)stream->cursor;
      for ( count = 0; count <= num_subrs; count++ )
        offsets[count] = cid_get_offset( &p, dict->sd_bytes );

      FT_FRAME_EXIT();

      /* offsets must be ordered */
      for ( count = 1; count <= num_subrs; count++ )
        if ( offsets[count - 1] > offsets[count] )
        {
          FT_ERROR(( "cid_read_subrs: offsets are not ordered\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

      if ( offsets[num_subrs] > stream->size - cid->data_offset )
      {
        FT_ERROR(( "cid_read_subrs: too large `subrs' offsets\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* now, compute the size of subrs charstrings, */
      /* allocate, and read them                     */
      data_len = offsets[num_subrs] - offsets[0];

      if ( FT_QNEW_ARRAY( subr->code, num_subrs + 1 ) ||
           FT_QALLOC( subr->code[0], data_len )       )
        goto Fail;

      if ( FT_STREAM_SEEK( cid->data_offset + offsets[0] ) ||
           FT_STREAM_READ( subr->code[0], data_len )       )
        goto Fail;

      /* set up pointers */
      for ( count = 1; count <= num_subrs; count++ )
      {
        FT_ULong  len;


        len               = offsets[count] - offsets[count - 1];
        subr->code[count] = subr->code[count - 1] + len;
      }

      /* decrypt subroutines, but only if lenIV >= 0 */
      if ( lenIV >= 0 )
      {
        for ( count = 0; count < num_subrs; count++ )
        {
          FT_ULong  len;


          len = offsets[count + 1] - offsets[count];
          psaux->t1_decrypt( subr->code[count], len, 4330 );
        }
      }

      subr->num_subrs = (FT_Int)num_subrs;
    }

  Exit:
    FT_FREE( offsets );
    return error;

  Fail:
    if ( face->subrs )
    {
      for ( n = 0; n < cid->num_dicts; n++ )
      {
        if ( face->subrs[n].code )
          FT_FREE( face->subrs[n].code[0] );

        FT_FREE( face->subrs[n].code );
      }
      FT_FREE( face->subrs );
    }
    goto Exit;
  }